

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

Map * __thiscall MapLoader::readMapFile(MapLoader *this)

{
  pointer pbVar1;
  pointer pcVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  char cVar3;
  bool bVar4;
  int iVar5;
  string *mapName;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar6;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar7;
  string *mode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int *lineCount;
  int *countryID;
  int *continentCount;
  int *countryCount;
  istream *piVar9;
  value_type *pLineWords;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  vector<int,_std::allocator<int>_> *lineNums;
  Map *pMVar11;
  _Alloc_hider this_01;
  string *this_02;
  MapLoader *this_03;
  bool bVar12;
  undefined1 local_2aa;
  char local_2a9;
  bool *local_2a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_2a0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_298;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_290;
  string line;
  ifstream infile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&infile,(string *)this->pMapFile,_S_in);
  if ((abStack_218[*(long *)(_infile + -0x18)] & 5) == 0) {
    iVar5 = std::istream::peek();
    if (iVar5 != -1) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      mapName = (string *)operator_new(0x20);
      (mapName->_M_dataplus)._M_p = (pointer)&mapName->field_2;
      mapName->_M_string_length = 0;
      (mapName->field_2)._M_local_buf[0] = '\0';
      pvVar6 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)operator_new(0x18);
      (pvVar6->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar6->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar6->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar7 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)operator_new(0x18);
      (pvVar7->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar7->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar7->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)operator_new(0x18);
      (local_2a0->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_2a0->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_2a0->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_298 = pvVar7;
      local_290 = pvVar6;
      mode = (string *)operator_new(0x20);
      paVar8 = &mode->field_2;
      (mode->_M_dataplus)._M_p = (pointer)paVar8;
      mode->_M_string_length = 0;
      (mode->field_2)._M_local_buf[0] = '\0';
      lineCount = (int *)operator_new(4);
      *lineCount = 0;
      countryID = (int *)operator_new(4);
      *countryID = 1;
      continentCount = (int *)operator_new(4);
      *continentCount = 0;
      countryCount = (int *)operator_new(4);
      *countryCount = 0;
      local_2a8 = (bool *)operator_new(1);
      *local_2a8 = true;
      do {
        cVar3 = std::ios::widen((char)*(undefined8 *)(_infile + -0x18) + (char)(istream *)&infile);
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&infile,(string *)&line,cVar3);
        if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
          pMVar11 = initMapObject(mapName,local_290,local_298,local_2a0,local_2a8);
          pcVar2 = (mode->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != paVar8) {
            operator_delete(pcVar2,paVar8->_M_allocated_capacity + 1);
          }
          operator_delete(mode,0x20);
          operator_delete(lineCount,4);
          operator_delete(continentCount,4);
          operator_delete(countryCount,4);
          operator_delete(countryID,4);
          pvVar7 = local_290;
          pvVar6 = local_298;
          this_00 = local_2a0;
          if (*local_2a8 == true) {
            if (((local_290->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start ==
                 (local_290->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) ||
               ((local_298->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start ==
                (local_298->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)) {
              pMVar11 = (Map *)0x0;
            }
            else if ((local_2a0->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start ==
                     (local_2a0->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
              pMVar11 = (Map *)0x0;
            }
          }
          else {
            pMVar11 = (Map *)0x0;
          }
          operator_delete(local_2a8,1);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(pvVar7);
          operator_delete(pvVar7,0x18);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(pvVar6);
          operator_delete(pvVar6,0x18);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(this_00);
          operator_delete(this_00,0x18);
          goto LAB_00117805;
        }
        *lineCount = *lineCount + 1;
        pLineWords = (value_type *)operator_new(0x18);
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar12 = false;
        if ((line._M_string_length != 0) &&
           ((0x3b < (ulong)(byte)*line._M_dataplus._M_p ||
            ((0x800000000002400U >> ((ulong)(byte)*line._M_dataplus._M_p & 0x3f) & 1) == 0)))) {
          local_2aa = 10;
          _Var10 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )line._M_dataplus._M_p,
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(line._M_dataplus._M_p + line._M_string_length),
                              (_Iter_equals_val<const_char>)&local_2aa);
          line._M_string_length = (long)_Var10._M_current - (long)line._M_dataplus._M_p;
          *_Var10._M_current = '\0';
          local_2aa = 0xd;
          this_01 = line._M_dataplus;
          _Var10 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )line._M_dataplus._M_p,
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(line._M_dataplus._M_p + line._M_string_length),
                              (_Iter_equals_val<const_char>)&local_2aa);
          line._M_string_length = (long)_Var10._M_current - (long)line._M_dataplus._M_p;
          *_Var10._M_current = '\0';
          splitLine((MapLoader *)this_01._M_p,&line,pLineWords);
          getMapName((MapLoader *)this_01._M_p,mapName,pLineWords);
          bVar4 = checkSection((MapLoader *)this_01._M_p,mode,pLineWords);
          if (!bVar4) {
            iVar5 = std::__cxx11::string::compare((char *)mode);
            if (iVar5 == 0) goto LAB_0011764d;
            iVar5 = std::__cxx11::string::compare((char *)mode);
            if (iVar5 == 0) {
              *continentCount = *continentCount + 1;
              pvVar6 = local_290;
              if (0x20 < (ulong)((long)(pLineWords->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pLineWords->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)) {
LAB_00117645:
                std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::push_back(pvVar6,pLineWords);
                goto LAB_0011764d;
              }
              *local_2a8 = false;
              bVar12 = true;
            }
            else {
              this_02 = mode;
              iVar5 = std::__cxx11::string::compare((char *)mode);
              if (iVar5 == 0) {
                bVar4 = validateCountryLine((MapLoader *)this_02,countryCount,pLineWords,lineCount,
                                            local_2a8,countryID,continentCount,false);
                bVar12 = true;
                pvVar6 = local_298;
                if (bVar4) goto LAB_00117645;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)mode);
                if (iVar5 == 0) {
                  this_03 = (MapLoader *)0x18;
                  lineNums = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
                  (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_2a9 = validateBordersLine(this_03,lineNums,pLineWords,lineCount,local_2a8,
                                                  countryCount,false);
                  bVar12 = true;
                  if (((bool)local_2a9) &&
                     (std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::push_back(local_2a0,lineNums), local_2a9 != '\0')) goto LAB_0011764d;
                }
                else {
                  pbVar1 = (pLineWords->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((pLineWords->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
                  }
                  iVar5 = std::__cxx11::string::compare((char *)pbVar1);
                  if (iVar5 != 0) {
LAB_0011764d:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(pLineWords);
                    operator_delete(pLineWords,0x18);
                    bVar12 = false;
                  }
                }
              }
            }
          }
        }
      } while (!bVar12);
      pMVar11 = (Map *)0x0;
LAB_00117805:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,
                        CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                 line.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001172e3;
    }
  }
  pMVar11 = (Map *)0x0;
LAB_001172e3:
  std::ifstream::~ifstream(&infile);
  return pMVar11;
}

Assistant:

Map* MapLoader::readMapFile() {
    //for debug purposes, change to true to print errors and warnings
    bool verbose = false;
    //create file stream to read file line by line
    std::ifstream infile(*pMapFile);
    if(!infile || infile.peek() == EOF){
        return nullptr;
    }
    std::string line;

    //declare map info
    auto* pMapName = new std::string;
    auto* pContinentData = new std::vector<std::vector<std::string>>;
    auto* pCountryData = new std::vector<std::vector<std::string>>;
    auto* pBorderData = new std::vector<std::vector<int>>;
    auto* pMode = new std::string;

    //maintain counters for validation / error tracing
    auto* pLineCount = new int(0);
    auto* pCountryID = new int(1);
    auto* pContinentCount = new int(0);
    auto* pCountryCount = new int(0);
    auto* pValidMap = new bool(true);

    while (std::getline(infile, line)) {
        (*pLineCount)++;
        //will hold the words of each line (separated by spaces) in an array
        auto* pLineWords = new std::vector<std::string>;
        //ignore comments or empty lines
        if (line.empty() || line[0] == *";" || line[0] == *"\n" || line[0] == *"\r") {
            //do nothing, the line is empty or is a comment
            continue;
        } else {
            // strip every line of the \n and \r characters
            line.erase(std::remove(line.begin(), line.end(), '\n'), line.end());
            line.erase(std::remove(line.begin(), line.end(), '\r'), line.end());
            splitLine(line, pLineWords);
            getMapName(pMapName, pLineWords);

            if (checkSection(pMode, pLineWords)) {
                continue;
            }

            //read sections
            if (*pMode == "files") {
                //this mode is in every example file, do we need it?
                if(verbose){
                    std::cout << "Line " << *pLineCount
                              << " - [WARNING] : the parser encountered the file mode, which is not supported at the moment.\n";
                }
            } else if (*pMode == "continents") {
                if (validateContinentLine(pContinentCount, pLineWords, pLineCount, pValidMap,verbose)) {
                    pContinentData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "countries") {
                if (validateCountryLine(pCountryCount, pLineWords, pLineCount, pValidMap, pCountryID,
                                        pContinentCount,verbose)) {
                    pCountryData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "borders") {
                auto* pLineNums = new std::vector<int>;
                if (validateBordersLine(pLineNums, pLineWords, pLineCount, pValidMap, pCountryCount,verbose)) {
                    pBorderData->push_back(*pLineNums);
                } else {
                    return nullptr;
                }
            } else if (pLineWords->at(0) == "name") {
                continue;
            } else {
                //unknown mode error, will be ignored, non-critical
                if(verbose){
                    std::cout << "\nLine " << *pLineCount << " - [WARNING] : the parser encountered an unknown mode. ";
                    std::cout << " ::  " << line;
                }
            }
        }
        delete (pLineWords);
    }
    //create map object

    auto* map = initMapObject(pMapName, pContinentData, pCountryData, pBorderData, pValidMap);

    //clean up
    delete (pMode);
    delete (pLineCount);
    delete (pContinentCount);
    delete (pCountryCount);
    delete (pCountryID);

    if(!*pValidMap || pContinentData->empty() || pCountryData->empty() || pBorderData->empty()){
        delete (pValidMap);
        delete (pContinentData);
        delete (pCountryData);
        delete (pBorderData);
        return nullptr;
    }
    delete (pValidMap);
    delete (pContinentData);
    delete (pCountryData);
    delete (pBorderData);
    return map;
}